

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_UUID WcsMappingId(ON_Xform *ocsTransform,bool bBox)

{
  ON__UINT32 OVar1;
  uchar auVar2 [8];
  undefined7 in_register_00000031;
  ulong uVar3;
  bool bVar4;
  ON_UUID OVar5;
  
  bVar4 = (int)CONCAT71(in_register_00000031,bBox) != 0;
  uVar3 = 0x4e3d341e47d62129;
  if (bVar4) {
    uVar3 = 0x46fb96174dc9aa78;
  }
  auVar2[0] = 0xbf;
  auVar2[1] = '\x11';
  auVar2[2] = 0x9c;
  auVar2[3] = '\x05';
  auVar2[4] = '\x1a';
  auVar2[5] = 0xf4;
  auVar2[6] = 0xed;
  auVar2[7] = 0x98;
  if (bVar4) {
    auVar2[0] = 0x92;
    auVar2[1] = '?';
    auVar2[2] = '>';
    auVar2[3] = 'e';
    auVar2[4] = 0xe1;
    auVar2[5] = 'A';
    auVar2[6] = 0x82;
    auVar2[7] = 0xfc;
  }
  OVar1 = ON_Xform::CRC32(ocsTransform,(ON__UINT32)uVar3);
  OVar5._0_8_ = (ulong)OVar1 | uVar3 & 0x4effb61f00000000;
  OVar5.Data4[0] = auVar2[0];
  OVar5.Data4[1] = auVar2[1];
  OVar5.Data4[2] = auVar2[2];
  OVar5.Data4[3] = auVar2[3];
  OVar5.Data4[4] = auVar2[4];
  OVar5.Data4[5] = auVar2[5];
  OVar5.Data4[6] = auVar2[6];
  OVar5.Data4[7] = auVar2[7];
  return OVar5;
}

Assistant:

static ON_UUID WcsMappingId(const ON_Xform& ocsTransform, bool bBox)
{
  // {47D62129-341E-4E3D-BF11-9C051AF4ED98}
  static const ON_UUID uuidBaseWcs =
  { 0x47d62129, 0x341e, 0x4e3d, { 0xbf, 0x11, 0x9c, 0x5, 0x1a, 0xf4, 0xed, 0x98 } };

  // {4DC9AA78-9617-46FB-923F-3E65E14182FC}
  static const ON_UUID uuidBaseWcsBox =
  { 0x4dc9aa78, 0x9617, 0x46fb, { 0x92, 0x3f, 0x3e, 0x65, 0xe1, 0x41, 0x82, 0xfc } };

  ON_UUID uuid = bBox ? uuidBaseWcsBox : uuidBaseWcs;
  uuid.Data1 = ocsTransform.CRC32(uuid.Data1);
  return uuid;
}